

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressionMargin(void *src,size_t srcSize)

{
  uint uVar1;
  int iVar2;
  size_t code;
  ulong in_RSI;
  size_t in_stack_00000008;
  size_t err_code;
  ZSTD_frameHeader zfh;
  unsigned_long_long decompressedBound;
  size_t compressedSize;
  ZSTD_frameSizeInfo frameSizeInfo;
  uint maxBlockSize;
  size_t margin;
  void *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint local_70;
  int local_6c;
  uint local_68;
  int local_60;
  long local_40;
  ulong local_38;
  long local_30;
  uint local_24;
  long local_20;
  ulong local_18;
  
  local_20 = 0;
  local_24 = 0;
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == 0) {
      return (ulong)local_24 + local_20;
    }
    ZSTD_findFrameSizeInfo((void *)err_code,in_stack_00000008);
    code = ZSTD_getFrameHeader((ZSTD_frameHeader *)
                               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                               in_stack_ffffffffffffff68,0x28868f);
    uVar1 = ERR_isError(code);
    if (uVar1 != 0) {
      return code;
    }
    uVar1 = ZSTD_isError(0x2886c1);
    if ((uVar1 != 0) || (local_30 == -2)) {
      return 0xffffffffffffffec;
    }
    if (local_6c == 0) {
      iVar2 = 0;
      if (local_60 != 0) {
        iVar2 = 4;
      }
      local_20 = local_40 * 3 + (long)iVar2 + (ulong)local_68 + local_20;
      in_stack_ffffffffffffff74 = local_70;
      uVar1 = local_70;
      if (local_70 < local_24) {
        in_stack_ffffffffffffff74 = local_24;
        uVar1 = local_24;
      }
    }
    else {
      if (local_6c != 1) {
        __assert_fail("zfh.frameType == ZSTD_skippableFrame",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9ea5,"size_t ZSTD_decompressionMargin(const void *, size_t)");
      }
      local_20 = local_38 + local_20;
      uVar1 = local_24;
    }
    local_24 = uVar1;
    if (local_18 < local_38) break;
    local_18 = local_18 - local_38;
  }
  __assert_fail("srcSize >= compressedSize",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9eaa,"size_t ZSTD_decompressionMargin(const void *, size_t)");
}

Assistant:

size_t ZSTD_decompressionMargin(void const* src, size_t srcSize)
{
    size_t margin = 0;
    unsigned maxBlockSize = 0;

    /* Iterate over each frame */
    while (srcSize > 0) {
        ZSTD_frameSizeInfo const frameSizeInfo = ZSTD_findFrameSizeInfo(src, srcSize);
        size_t const compressedSize = frameSizeInfo.compressedSize;
        unsigned long long const decompressedBound = frameSizeInfo.decompressedBound;
        ZSTD_frameHeader zfh;

        FORWARD_IF_ERROR(ZSTD_getFrameHeader(&zfh, src, srcSize), "");
        if (ZSTD_isError(compressedSize) || decompressedBound == ZSTD_CONTENTSIZE_ERROR)
            return ERROR(corruption_detected);

        if (zfh.frameType == ZSTD_frame) {
            /* Add the frame header to our margin */
            margin += zfh.headerSize;
            /* Add the checksum to our margin */
            margin += zfh.checksumFlag ? 4 : 0;
            /* Add 3 bytes per block */
            margin += 3 * frameSizeInfo.nbBlocks;

            /* Compute the max block size */
            maxBlockSize = MAX(maxBlockSize, zfh.blockSizeMax);
        } else {
            assert(zfh.frameType == ZSTD_skippableFrame);
            /* Add the entire skippable frame size to our margin. */
            margin += compressedSize;
        }

        assert(srcSize >= compressedSize);
        src = (const BYTE*)src + compressedSize;
        srcSize -= compressedSize;
    }

    /* Add the max block size back to the margin. */
    margin += maxBlockSize;

    return margin;
}